

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

char * uvTypeName(VType t)

{
  if (t < (VNUM|VARR)) {
    return &DAT_004d1d3c + *(int *)(&DAT_004d1d3c + (ulong)t * 4);
  }
  return (char *)0x0;
}

Assistant:

const char *uvTypeName(UniValue::VType t)
{
    switch (t) {
    case UniValue::VNULL: return "null";
    case UniValue::VBOOL: return "bool";
    case UniValue::VOBJ: return "object";
    case UniValue::VARR: return "array";
    case UniValue::VSTR: return "string";
    case UniValue::VNUM: return "number";
    }

    // not reached
    return NULL;
}